

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O3

void lm_trie_fill_raw_ngram
               (lm_trie_t *trie,ngram_raw_t *raw_ngrams,uint32 *raw_ngram_idx,uint32 *counts,
               node_range_t range,uint32 *hist,int n_hist,int order,int max_order)

{
  ngram_raw_t *pnVar1;
  middle_t *pmVar2;
  uint8 *puVar3;
  longest_t *plVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint uVar7;
  long lVar8;
  uint32 *puVar9;
  uint32 *puVar10;
  ulong uVar11;
  uint uVar12;
  node_range_t range_00;
  node_range_t range_01;
  int iVar13;
  int iVar14;
  float32 fVar15;
  float fVar16;
  bitarr_address_t address;
  bitarr_address_t address_00;
  bitarr_address_t address_01;
  bitarr_address_t address_02;
  bitarr_address_t address_03;
  bitarr_address_t address_04;
  bitarr_address_t address_05;
  bitarr_address_t address_06;
  
  uVar7 = range.begin;
  uVar12 = range.end;
  if (n_hist < 1 || uVar7 != uVar12) {
    if (n_hist == 0) {
      if (*counts != 0) {
        lVar8 = 0x14;
        uVar11 = 0;
        do {
          uVar5 = *(uint32 *)((long)&trie->unigrams[-1].prob + lVar8);
          uVar6 = *(uint32 *)((long)&trie->unigrams->prob + lVar8);
          *hist = (uint32)uVar11;
          range_01.end = uVar6;
          range_01.begin = uVar5;
          lm_trie_fill_raw_ngram
                    (trie,raw_ngrams,raw_ngram_idx,counts,range_01,hist,1,order,max_order);
          uVar11 = uVar11 + 1;
          lVar8 = lVar8 + 0xc;
        } while (uVar11 < *counts);
      }
    }
    else if (n_hist < order + -1) {
      if (uVar7 < uVar12) {
        lVar8 = (long)n_hist;
        pmVar2 = trie->middle_begin;
        do {
          puVar3 = pmVar2[lVar8 + -1].base.base;
          iVar13 = (uint)pmVar2[lVar8 + -1].base.total_bits * range.begin;
          address.offset = iVar13;
          address.base = puVar3;
          address._12_4_ = 0;
          uVar5 = bitarr_read_int25(address,pmVar2[lVar8 + -1].base.word_bits,
                                    pmVar2[lVar8 + -1].base.word_mask);
          hist[lVar8] = uVar5;
          address_00.offset =
               (uint)pmVar2[lVar8 + -1].quant_bits + (uint)pmVar2[lVar8 + -1].base.word_bits +
               iVar13;
          address_00.base = puVar3;
          address_00._12_4_ = 0;
          uVar5 = bitarr_read_int25(address_00,pmVar2[lVar8 + -1].next_mask.bits,
                                    pmVar2[lVar8 + -1].next_mask.mask);
          range.begin = range.begin + 1;
          range.end = 0;
          address_01.offset =
               (uint)pmVar2[lVar8 + -1].quant_bits + (uint)pmVar2[lVar8 + -1].base.word_bits +
               pmVar2[lVar8 + -1].base.total_bits * range.begin;
          address_01.base = puVar3;
          address_01._12_4_ = 0;
          uVar6 = bitarr_read_int25(address_01,pmVar2[lVar8 + -1].next_mask.bits,
                                    pmVar2[lVar8 + -1].next_mask.mask);
          range_00.end = uVar6;
          range_00.begin = uVar5;
          lm_trie_fill_raw_ngram
                    (trie,raw_ngrams,raw_ngram_idx,counts,range_00,hist,n_hist + 1,order,max_order);
        } while (uVar12 != range.begin);
      }
    }
    else {
      if (order + -1 != n_hist) {
        __assert_fail("n_hist == order - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0x36e,
                      "void lm_trie_fill_raw_ngram(lm_trie_t *, ngram_raw_t *, uint32 *, uint32 *, node_range_t, uint32 *, int, int, int)"
                     );
      }
      if (uVar7 < uVar12) {
        iVar13 = n_hist + -1;
        lVar8 = (long)n_hist;
        uVar7 = *raw_ngram_idx;
        do {
          pnVar1 = raw_ngrams + uVar7;
          uVar5 = range.begin;
          if (order == max_order) {
            plVar4 = trie->longest;
            puVar3 = (plVar4->base).base;
            iVar14 = (plVar4->base).total_bits * uVar5;
            address_02.offset = iVar14;
            address_02.base = puVar3;
            address_02._12_4_ = 0;
            uVar6 = bitarr_read_int25(address_02,(plVar4->base).word_bits,(plVar4->base).word_mask);
            hist[lVar8] = uVar6;
            address_04.offset = (uint)(plVar4->base).word_bits + iVar14;
            address_04.base = puVar3;
            address_04._12_4_ = 0;
            fVar15 = (float32)lm_trie_quant_lpread(trie->quant,address_04);
          }
          else {
            pmVar2 = trie->middle_begin;
            puVar3 = pmVar2[iVar13].base.base;
            iVar14 = pmVar2[iVar13].base.total_bits * uVar5;
            address_03.offset = iVar14;
            address_03.base = puVar3;
            address_03._12_4_ = 0;
            uVar6 = bitarr_read_int25(address_03,pmVar2[iVar13].base.word_bits,
                                      pmVar2[iVar13].base.word_mask);
            hist[lVar8] = uVar6;
            iVar14 = (uint)pmVar2[iVar13].base.word_bits + iVar14;
            address_05.offset = iVar14;
            address_05.base = puVar3;
            address_05._12_4_ = 0;
            fVar15 = (float32)lm_trie_quant_mpread(trie->quant,address_05,iVar13);
            address_06.offset = iVar14;
            address_06.base = puVar3;
            address_06._12_4_ = 0;
            fVar16 = lm_trie_quant_mboread(trie->quant,address_06,iVar13);
            pnVar1->backoff = (float32)fVar16;
          }
          pnVar1->prob = fVar15;
          puVar9 = (uint32 *)
                   __ckd_calloc__((long)order,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                  ,0x38c);
          pnVar1->words = puVar9;
          if (-1 < n_hist) {
            uVar11 = 0;
            puVar10 = hist + lVar8;
            do {
              puVar9[uVar11] = *puVar10;
              uVar11 = uVar11 + 1;
              puVar10 = puVar10 + -1;
            } while (n_hist + 1 != uVar11);
          }
          uVar7 = *raw_ngram_idx + 1;
          *raw_ngram_idx = uVar7;
          range.begin = uVar5 + 1;
          range.end = 0;
        } while (range.begin != uVar12);
      }
    }
  }
  return;
}

Assistant:

void
lm_trie_fill_raw_ngram(lm_trie_t * trie,
    		       ngram_raw_t * raw_ngrams, uint32 * raw_ngram_idx,
            	       uint32 * counts, node_range_t range, uint32 * hist,
    	               int n_hist, int order, int max_order)
{
    if (n_hist > 0 && range.begin == range.end) {
        return;
    }
    if (n_hist == 0) {
        uint32 i;
        for (i = 0; i < counts[0]; i++) {
            node_range_t node;
            unigram_find(trie->unigrams, i, &node);
            hist[0] = i;
            lm_trie_fill_raw_ngram(trie, raw_ngrams, raw_ngram_idx, counts,
                           node, hist, 1, order, max_order);
        }
    }
    else if (n_hist < order - 1) {
        uint32 ptr;
        node_range_t node;
        bitarr_address_t address;
        uint32 new_word;
        middle_t *middle = &trie->middle_begin[n_hist - 1];
        for (ptr = range.begin; ptr < range.end; ptr++) {
            address.base = middle->base.base;
            address.offset = ptr * middle->base.total_bits;
            new_word =
                bitarr_read_int25(address, middle->base.word_bits,
                                  middle->base.word_mask);
            hist[n_hist] = new_word;
            address.offset += middle->base.word_bits + middle->quant_bits;
            node.begin =
                bitarr_read_int25(address, middle->next_mask.bits,
                                  middle->next_mask.mask);
            address.offset =
                (ptr + 1) * middle->base.total_bits +
                middle->base.word_bits + middle->quant_bits;
            node.end =
                bitarr_read_int25(address, middle->next_mask.bits,
                                  middle->next_mask.mask);
            lm_trie_fill_raw_ngram(trie, raw_ngrams, raw_ngram_idx, counts,
                           node, hist, n_hist + 1, order, max_order);
        }
    }
    else {
        bitarr_address_t address;
        uint32 ptr;
        float prob, backoff;
        int i;
        assert(n_hist == order - 1);
        for (ptr = range.begin; ptr < range.end; ptr++) {
            ngram_raw_t *raw_ngram = &raw_ngrams[*raw_ngram_idx];
            if (order == max_order) {
                longest_t *longest = trie->longest;
                address.base = longest->base.base;
                address.offset = ptr * longest->base.total_bits;
                hist[n_hist] =
                    bitarr_read_int25(address, longest->base.word_bits,
                                      longest->base.word_mask);
                address.offset += longest->base.word_bits;
                prob = lm_trie_quant_lpread(trie->quant, address);
            }
            else {
                middle_t *middle = &trie->middle_begin[n_hist - 1];
                address.base = middle->base.base;
                address.offset = ptr * middle->base.total_bits;
                hist[n_hist] =
                    bitarr_read_int25(address, middle->base.word_bits,
                                      middle->base.word_mask);
                address.offset += middle->base.word_bits;
                prob =
                    lm_trie_quant_mpread(trie->quant, address, n_hist - 1);
                backoff =
                    lm_trie_quant_mboread(trie->quant, address,
                                          n_hist - 1);
                raw_ngram->backoff = backoff;
            }
            raw_ngram->prob = prob;
            raw_ngram->words =
                (uint32 *) ckd_calloc(order, sizeof(*raw_ngram->words));
            for (i = 0; i <= n_hist; i++) {
                raw_ngram->words[i] = hist[n_hist - i];
            }
            (*raw_ngram_idx)++;
        }
    }
}